

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O2

void __thiscall sf::priv::ClipboardImpl::processEvent(ClipboardImpl *this,XEvent *windowEvent)

{
  String *this_00;
  Time TVar1;
  Atom AVar2;
  int iVar3;
  Atom AVar4;
  Atom type;
  vector<unsigned_long,_std::allocator<unsigned_long>_> targets;
  uchar *data;
  int format;
  locale local_80 [8];
  unsigned_long items;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_70
  ;
  Window local_50;
  Window local_48;
  Atom local_40;
  Atom local_38;
  int iStack_30;
  int iStack_2c;
  unsigned_long remainingBytes;
  
  if (windowEvent->type != 0x1e) {
    if (windowEvent->type != 0x1f) {
      return;
    }
    this_00 = &this->m_clipboardContents;
    String::clear(this_00);
    if ((windowEvent->xkey).time == 0) {
      return;
    }
    if ((windowEvent->xkey).root != this->m_clipboard) {
      return;
    }
    data = (uchar *)0x0;
    iVar3 = XGetWindowProperty(this->m_display,this->m_window,this->m_targetProperty,0,0x7fffffff,0,
                               0,&type,&format,&items,&remainingBytes,&data);
    AVar2 = type;
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&local_70,"INCR",(allocator *)&targets);
      AVar4 = getAtom((string *)&local_70,false);
      std::__cxx11::string::~string((string *)&local_70);
      if (AVar2 != AVar4) {
        if (format == 8 && type == this->m_utf8String) {
          String::fromUtf8<unsigned_char*>
                    ((String *)&local_70,(String *)data,data + items,(uchar *)(ulong)(uint)format);
          String::operator=(this_00,(String *)&local_70);
          std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~basic_string(&local_70);
        }
        else if (type == 0x1f && format == 8) {
          targets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&targets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<unsigned_char*>((string *)&targets,data,data + items);
          std::locale::locale(local_80);
          String::String((String *)&local_70,(string *)&targets,local_80);
          String::operator=(this_00,(String *)&local_70);
          std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~basic_string(&local_70);
          std::locale::~locale(local_80);
          std::__cxx11::string::~string((string *)&targets);
        }
      }
      XFree(data);
      XDeleteProperty(this->m_display,this->m_window,this->m_targetProperty);
    }
    this->m_requestResponded = true;
    return;
  }
  local_70._M_dataplus._M_p._0_4_ = 0x1f;
  local_50 = (windowEvent->xkey).root;
  local_48 = (windowEvent->xkey).subwindow;
  local_38 = (windowEvent->xselectionrequest).property;
  iStack_30 = (windowEvent->xkey).x_root;
  iStack_2c = (windowEvent->xkey).y_root;
  local_40 = (windowEvent->xkey).time;
  if (local_48 == this->m_clipboard) {
    if (local_40 == this->m_targets) {
      targets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      targets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      targets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&targets,&this->m_targets)
      ;
      Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&targets,&this->m_text);
      type = 0x1f;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&targets,&type);
      if (this->m_utf8String != 0) {
        Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&targets,
                   &this->m_utf8String);
      }
      XChangeProperty(this->m_display,(windowEvent->xkey).root,
                      (windowEvent->xselectionrequest).property,4,0x20,0,
                      targets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)targets.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)targets.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_40 = this->m_targets;
      XSendEvent(this->m_display,(windowEvent->xkey).root,1,0);
      Catch::clara::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&targets);
      return;
    }
    if (local_40 != 0x1f) {
      TVar1 = this->m_utf8String;
      if (local_40 != this->m_text || TVar1 != 0) {
        if ((TVar1 != 0) && (local_40 == TVar1 || local_40 == this->m_text)) {
          String::toUtf8_abi_cxx11_
                    ((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                      *)&targets,&this->m_clipboardContents);
          XChangeProperty(this->m_display,(windowEvent->xkey).root,
                          (windowEvent->xselectionrequest).property,this->m_utf8String,8,0,
                          targets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (ulong)targets.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish & 0xffffffff);
          local_40 = this->m_utf8String;
          XSendEvent(this->m_display,(windowEvent->xkey).root,1,0);
          std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::~basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                           *)&targets);
          return;
        }
        goto LAB_001ca441;
      }
    }
    std::locale::locale((locale *)&type);
    String::toAnsiString_abi_cxx11_((string *)&targets,&this->m_clipboardContents,(locale *)&type);
    std::locale::~locale((locale *)&type);
    XChangeProperty(this->m_display,(windowEvent->xkey).root,
                    (windowEvent->xselectionrequest).property,0x1f,8,0,
                    targets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)targets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff);
    local_40 = 0x1f;
    XSendEvent(this->m_display,(windowEvent->xkey).root,1,0);
    std::__cxx11::string::~string((string *)&targets);
  }
  else {
LAB_001ca441:
    local_38 = 0;
    XSendEvent(this->m_display,local_50,1,0);
  }
  return;
}

Assistant:

void ClipboardImpl::processEvent(XEvent& windowEvent)
{
    switch (windowEvent.type)
    {
        case SelectionClear:
        {
            // We don't have any resources we need to clean up
            // when losing selection ownership so we don't do
            // anything when we receive SelectionClear
            // We will still respond to any future SelectionRequest
            // events since doing so doesn't really do any harm
            break;
        }
        case SelectionNotify:
        {
            // Notification that the current selection owner
            // has responded to our request

            XSelectionEvent& selectionEvent = windowEvent.xselection;

            m_clipboardContents.clear();

            // If retrieving the selection fails or conversion is unsuccessful
            // we leave the contents of the clipboard empty since we don't
            // own it and we don't know what it could currently be
            if ((selectionEvent.property == None) || (selectionEvent.selection != m_clipboard))
                break;

            Atom type;
            int format;
            unsigned long items;
            unsigned long remainingBytes;
            unsigned char* data = 0;

            // The selection owner should have wrote the selection
            // data to the specified window property
            int result = XGetWindowProperty(
                m_display,
                m_window,
                m_targetProperty,
                0,
                0x7fffffff,
                False,
                AnyPropertyType,
                &type,
                &format,
                &items,
                &remainingBytes,
                &data
            );

            if (result == Success)
            {
                // We don't support INCR for now
                // It is very unlikely that this will be returned
                // for purely text data transfer anyway
                if (type != getAtom("INCR", false))
                {
                    // Only copy the data if the format is what we expect
                    if ((type == m_utf8String) && (format == 8))
                    {
                        m_clipboardContents = String::fromUtf8(data, data + items);
                    }
                    else if ((type == XA_STRING) && (format == 8))
                    {
                        // Convert from ANSI std::string to sf::String
                        m_clipboardContents = std::string(data, data + items);
                    }
                }

                XFree(data);

                // The selection requestor must always delete the property themselves
                XDeleteProperty(m_display, m_window, m_targetProperty);
            }

            m_requestResponded = true;

            break;
        }
        case SelectionRequest:
        {
            // Respond to a request for our clipboard contents
            XSelectionRequestEvent& selectionRequestEvent = windowEvent.xselectionrequest;

            // Our reply
            XSelectionEvent selectionEvent;

            selectionEvent.type      = SelectionNotify;
            selectionEvent.requestor = selectionRequestEvent.requestor;
            selectionEvent.selection = selectionRequestEvent.selection;
            selectionEvent.property  = selectionRequestEvent.property;
            selectionEvent.time      = selectionRequestEvent.time;

            if (selectionRequestEvent.selection == m_clipboard)
            {
                if (selectionRequestEvent.target == m_targets)
                {
                    // Respond to a request for our valid conversion targets
                    std::vector<Atom> targets;

                    targets.push_back(m_targets);
                    targets.push_back(m_text);
                    targets.push_back(XA_STRING);

                    if (m_utf8String != None)
                        targets.push_back(m_utf8String);

                    XChangeProperty(
                        m_display,
                        selectionRequestEvent.requestor,
                        selectionRequestEvent.property,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        reinterpret_cast<unsigned char*>(&targets[0]),
                        static_cast<int>(targets.size())
                    );

                    // Notify the requestor that they can read the targets from their window property
                    selectionEvent.target = m_targets;

                    XSendEvent(m_display, selectionRequestEvent.requestor, True, NoEventMask, reinterpret_cast<XEvent*>(&selectionEvent));

                    break;
                }
                else if ((selectionRequestEvent.target == XA_STRING) || ((m_utf8String == None) && (selectionRequestEvent.target == m_text)))
                {
                    // Respond to a request for conversion to a Latin-1 string
                    std::string data = m_clipboardContents.toAnsiString();

                    XChangeProperty(
                        m_display,
                        selectionRequestEvent.requestor,
                        selectionRequestEvent.property,
                        XA_STRING,
                        8,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(data.c_str()),
                        static_cast<int>(data.size())
                    );

                    // Notify the requestor that they can read the data from their window property
                    selectionEvent.target = XA_STRING;

                    XSendEvent(m_display, selectionRequestEvent.requestor, True, NoEventMask, reinterpret_cast<XEvent*>(&selectionEvent));

                    break;
                }
                else if ((m_utf8String != None) && ((selectionRequestEvent.target == m_utf8String) || (selectionRequestEvent.target == m_text)))
                {
                    // Respond to a request for conversion to a UTF-8 string
                    // or an encoding of our choosing (we always choose UTF-8)
                    std::basic_string<Uint8> data = m_clipboardContents.toUtf8();

                    XChangeProperty(
                        m_display,
                        selectionRequestEvent.requestor,
                        selectionRequestEvent.property,
                        m_utf8String,
                        8,
                        PropModeReplace,
                        data.c_str(),
                        static_cast<int>(data.size())
                    );

                    // Notify the requestor that they can read the data from their window property
                    selectionEvent.target = m_utf8String;

                    XSendEvent(m_display, selectionRequestEvent.requestor, True, NoEventMask, reinterpret_cast<XEvent*>(&selectionEvent));

                    break;
                }
            }

            // Notify the requestor that we could not respond to their request
            selectionEvent.target = selectionRequestEvent.target;
            selectionEvent.property = None;

            XSendEvent(m_display, selectionRequestEvent.requestor, True, NoEventMask, reinterpret_cast<XEvent*>(&selectionEvent));

            break;
        }
        default:
            break;
    }
}